

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliLZ77Greedy(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     ZopfliLZ77Store *store,ZopfliHash *h)

{
  int iVar1;
  uchar *in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  ZopfliHash *in_R9;
  int match_available;
  int prevlengthscore;
  uint prev_match;
  uint prev_length;
  unsigned_short dummysublen [259];
  size_t windowstart;
  int lengthscore;
  unsigned_short dist;
  unsigned_short leng;
  size_t j;
  size_t i;
  ZopfliHash *in_stack_fffffffffffffd78;
  size_t in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  uchar *puVar2;
  int iVar3;
  int in_stack_fffffffffffffd9c;
  uint distance;
  uint length;
  size_t in_stack_fffffffffffffda8;
  uchar *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  uchar *in_stack_fffffffffffffe00;
  ZopfliHash *in_stack_fffffffffffffe08;
  ZopfliBlockState *in_stack_fffffffffffffe10;
  ZopfliLZ77Store *in_stack_fffffffffffffe20;
  unsigned_short *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  unsigned_short in_stack_fffffffffffffe34;
  unsigned_short in_stack_fffffffffffffe36;
  ushort local_44;
  ushort local_42;
  ulong local_40;
  uchar *local_38;
  
  if (in_RDX < (uchar *)0x8001) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = in_RDX + -0x8000;
  }
  length = 0;
  distance = 0;
  iVar3 = 0;
  if (in_RDX != in_RCX) {
    puVar2 = local_38;
    ZopfliResetHash(0x8000,in_R9);
    ZopfliWarmupHash(puVar2,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                     in_stack_fffffffffffffd78);
    for (; puVar2 = in_RDX, local_38 < in_RDX; local_38 = local_38 + 1) {
      ZopfliUpdateHash(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,CONCAT44(length,distance)
                       ,(ZopfliHash *)CONCAT44(in_stack_fffffffffffffd9c,iVar3));
    }
    while (local_38 = puVar2, local_38 < in_RCX) {
      ZopfliUpdateHash(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,CONCAT44(length,distance)
                       ,(ZopfliHash *)CONCAT44(in_stack_fffffffffffffd9c,iVar3));
      ZopfliFindLongestMatch
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (unsigned_short *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                 (unsigned_short *)
                 CONCAT26(in_stack_fffffffffffffe36,
                          CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
      iVar1 = GetLengthScore((uint)local_42,(uint)local_44);
      in_stack_fffffffffffffd9c = GetLengthScore(length,distance);
      if (iVar3 == 0) {
        if ((iVar1 < 3) || (0x101 < local_42)) {
          iVar3 = 0;
LAB_00154fe9:
          if (iVar1 < 3) {
            local_42 = 1;
            ZopfliStoreLitLenDist
                      (in_stack_fffffffffffffe36,in_stack_fffffffffffffe34,
                       (size_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          }
          else {
            ZopfliVerifyLenDist(in_RSI,(size_t)in_RCX,(size_t)local_38,local_44,local_42);
            ZopfliStoreLitLenDist
                      (in_stack_fffffffffffffe36,in_stack_fffffffffffffe34,
                       (size_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          }
          for (local_40 = 1; local_40 < local_42; local_40 = local_40 + 1) {
            local_38 = local_38 + 1;
            ZopfliUpdateHash(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                             CONCAT44(length,distance),
                             (ZopfliHash *)CONCAT44(in_stack_fffffffffffffd9c,iVar3));
          }
        }
        else {
          iVar3 = 1;
          length = (uint)local_42;
          distance = (uint)local_44;
        }
      }
      else {
        iVar3 = 0;
        if (in_stack_fffffffffffffd9c + 1 < iVar1) {
          ZopfliStoreLitLenDist
                    (in_stack_fffffffffffffe36,in_stack_fffffffffffffe34,
                     (size_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          if ((iVar1 < 3) || (0x101 < local_42)) goto LAB_00154fe9;
          iVar3 = 1;
          length = (uint)local_42;
          distance = (uint)local_44;
        }
        else {
          local_42 = (ushort)length;
          local_44 = (ushort)distance;
          ZopfliVerifyLenDist(in_RSI,(size_t)in_RCX,(size_t)(local_38 + -1),local_44,local_42);
          ZopfliStoreLitLenDist
                    (in_stack_fffffffffffffe36,in_stack_fffffffffffffe34,
                     (size_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          for (local_40 = 2; local_40 < local_42; local_40 = local_40 + 1) {
            local_38 = local_38 + 1;
            ZopfliUpdateHash(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                             CONCAT44(length,distance),
                             (ZopfliHash *)CONCAT44(in_stack_fffffffffffffd9c,iVar3));
          }
        }
      }
      puVar2 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void ZopfliLZ77Greedy(ZopfliBlockState* s, const unsigned char* in,
                      size_t instart, size_t inend,
                      ZopfliLZ77Store* store, ZopfliHash* h) {
  size_t i = 0, j;
  unsigned short leng;
  unsigned short dist;
  int lengthscore;
  size_t windowstart = instart > ZOPFLI_WINDOW_SIZE
      ? instart - ZOPFLI_WINDOW_SIZE : 0;
  unsigned short dummysublen[259];

#ifdef ZOPFLI_LAZY_MATCHING
  /* Lazy matching. */
  unsigned prev_length = 0;
  unsigned prev_match = 0;
  int prevlengthscore;
  int match_available = 0;
#endif

  if (instart == inend) return;

  ZopfliResetHash(ZOPFLI_WINDOW_SIZE, h);
  ZopfliWarmupHash(in, windowstart, inend, h);
  for (i = windowstart; i < instart; i++) {
    ZopfliUpdateHash(in, i, inend, h);
  }

  for (i = instart; i < inend; i++) {
    ZopfliUpdateHash(in, i, inend, h);

    ZopfliFindLongestMatch(s, h, in, i, inend, ZOPFLI_MAX_MATCH, dummysublen,
                           &dist, &leng);
    lengthscore = GetLengthScore(leng, dist);

#ifdef ZOPFLI_LAZY_MATCHING
    /* Lazy matching. */
    prevlengthscore = GetLengthScore(prev_length, prev_match);
    if (match_available) {
      match_available = 0;
      if (lengthscore > prevlengthscore + 1) {
        ZopfliStoreLitLenDist(in[i - 1], 0, i - 1, store);
        if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
          match_available = 1;
          prev_length = leng;
          prev_match = dist;
          continue;
        }
      } else {
        /* Add previous to output. */
        leng = prev_length;
        dist = prev_match;
        lengthscore = prevlengthscore;
        /* Add to output. */
        ZopfliVerifyLenDist(in, inend, i - 1, dist, leng);
        ZopfliStoreLitLenDist(leng, dist, i - 1, store);
        for (j = 2; j < leng; j++) {
          assert(i < inend);
          i++;
          ZopfliUpdateHash(in, i, inend, h);
        }
        continue;
      }
    }
    else if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
      match_available = 1;
      prev_length = leng;
      prev_match = dist;
      continue;
    }
    /* End of lazy matching. */
#endif

    /* Add to output. */
    if (lengthscore >= ZOPFLI_MIN_MATCH) {
      ZopfliVerifyLenDist(in, inend, i, dist, leng);
      ZopfliStoreLitLenDist(leng, dist, i, store);
    } else {
      leng = 1;
      ZopfliStoreLitLenDist(in[i], 0, i, store);
    }
    for (j = 1; j < leng; j++) {
      assert(i < inend);
      i++;
      ZopfliUpdateHash(in, i, inend, h);
    }
  }
}